

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

bool google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
               (Descriptor *message,string *classname)

{
  size_t __n;
  size_t __n_00;
  pointer __s2;
  bool bVar1;
  int iVar2;
  Descriptor *message_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  
  __n = (*(undefined8 **)message)[1];
  __n_00 = classname->_M_string_length;
  if (__n == __n_00) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((void *)**(undefined8 **)message,(classname->_M_dataplus)._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  lVar4 = (long)*(int *)(message + 0x48);
  if (0 < lVar4) {
    message_00 = *(Descriptor **)(message + 0x50);
    do {
      bVar1 = MessageHasConflictingClassName(message_00,classname);
      if (bVar1) {
        return true;
      }
      message_00 = message_00 + 0xa8;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  uVar3 = (ulong)*(int *)(message + 0x58);
  if ((long)uVar3 < 1) {
    bVar1 = false;
  }
  else {
    plVar6 = *(long **)(message + 0x60);
    __s2 = (classname->_M_dataplus)._M_p;
    uVar5 = 0;
    do {
      if (((undefined8 *)*plVar6)[1] == __n_00) {
        if (__n_00 == 0) {
          return true;
        }
        iVar2 = bcmp(*(void **)*plVar6,__s2,__n_00);
        if (iVar2 == 0) {
          return true;
        }
      }
      uVar5 = uVar5 + 1;
      plVar6 = plVar6 + 7;
    } while (uVar3 != uVar5);
    bVar1 = uVar5 < uVar3;
  }
  return bVar1;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    const string& classname) {
  if (message->name() == classname) return true;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (message->enum_type(i)->name() == classname) {
      return true;
    }
  }
  return false;
}